

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O3

void __thiscall TreeDecomposition::buildFromFile(TreeDecomposition *this)

{
  vector<TDNode_*,_std::allocator<TDNode_*>_> *this_00;
  vector<Attribute_*,_std::allocator<Attribute_*>_> *this_01;
  ulong *puVar1;
  int iVar2;
  mapped_type mVar3;
  iterator iVar4;
  pointer puVar5;
  pointer puVar6;
  char *pcVar7;
  char cVar8;
  int iVar9;
  istream *piVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Attribute *pAVar15;
  mapped_type *pmVar16;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var17;
  TDNode *pTVar18;
  pointer ppTVar19;
  bitset<100UL> *pbVar20;
  undefined8 uVar21;
  size_t *__args;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *ID;
  long *plVar22;
  ulong uVar23;
  long *plVar24;
  _WordT _Var25;
  Type TVar26;
  long lVar27;
  var_bitset schema;
  string line;
  string name;
  string node1;
  string attrs;
  string index;
  string node2;
  string eString;
  string mString;
  string nString;
  string type;
  string attribute;
  stringstream ssLine;
  ifstream input;
  char *local_5b8;
  long local_5b0;
  char local_5a8 [16];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_598;
  key_type local_590;
  long *local_570;
  long local_568;
  long local_560;
  long lStack_558;
  key_type local_550;
  long *local_530;
  long local_528;
  undefined1 local_520 [16];
  undefined1 *local_510;
  long local_508;
  undefined1 local_500 [16];
  char *local_4f0;
  undefined8 local_4e8;
  char local_4e0 [16];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_4d0;
  vector<Attribute_*,_std::allocator<Attribute_*>_> *local_4c8;
  key_type local_4c0;
  string local_4a0;
  char *local_480;
  undefined8 local_478;
  char local_470 [16];
  char *local_460;
  undefined8 local_458;
  char local_450 [16];
  char *local_440;
  undefined8 local_438;
  char local_430 [16];
  undefined1 *local_420;
  undefined8 local_418;
  undefined1 local_410 [16];
  key_type local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3c0 [128];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream
            ((istream *)local_238,(string *)multifaq::config::TREEDECOMP_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_0029f2bc;
  local_5b8 = local_5a8;
  local_5b0 = 0;
  local_5a8[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  local_590._M_string_length = 0;
  local_590.field_2._M_local_buf[0] = '\0';
  local_420 = local_410;
  local_418 = 0;
  local_410[0] = 0;
  local_530 = (long *)local_520;
  local_528 = 0;
  local_520[0] = 0;
  local_4f0 = local_4e0;
  local_4e8 = 0;
  local_4e0[0] = '\0';
  do {
    cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_238,(string *)&local_5b8,cVar8);
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
  } while ((*local_5b8 == '#') ||
          (iVar9 = std::__cxx11::string::compare((char *)&local_5b8), iVar9 == 0));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_3c0 + 0x10),local_5b8,local_5b0);
  local_440 = local_430;
  local_438 = 0;
  local_430[0] = '\0';
  local_460 = local_450;
  local_458 = 0;
  local_450[0] = '\0';
  local_480 = local_470;
  local_478 = 0;
  local_470[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_440,' ');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_460,' ');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_3c0,(string *)&local_480,' ');
  std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)(istream *)local_3c0);
  pcVar7 = local_440;
  piVar11 = __errno_location();
  iVar9 = *piVar11;
  *piVar11 = 0;
  uVar12 = strtoul(pcVar7,(char **)&local_550,10);
  if (local_550._M_dataplus._M_p == pcVar7) {
    std::__throw_invalid_argument("stoul");
  }
  else {
    iVar2 = *piVar11;
    if (iVar2 == 0) {
LAB_0029e57b:
      *piVar11 = iVar9;
      iVar2 = iVar9;
    }
    else if (iVar2 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_0029e57b;
    }
    pcVar7 = local_460;
    *piVar11 = 0;
    local_598 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)strtoul(local_460,(char **)&local_550,10);
    if (local_550._M_dataplus._M_p != pcVar7) {
      iVar9 = *piVar11;
      if (iVar9 == 0) {
LAB_0029e5d3:
        *piVar11 = iVar2;
        iVar9 = iVar2;
      }
      else if (iVar9 == 0x22) {
        std::__throw_out_of_range("stoul");
        goto LAB_0029e5d3;
      }
      pcVar7 = local_480;
      *piVar11 = 0;
      uVar13 = strtoul(local_480,(char **)&local_550,10);
      if (local_550._M_dataplus._M_p != pcVar7) {
        if (*piVar11 != 0) {
          if (*piVar11 != 0x22) goto LAB_0029e635;
          std::__throw_out_of_range("stoul");
        }
        *piVar11 = iVar9;
LAB_0029e635:
        this->_numOfAttributes = uVar12;
        this->_numOfRelations = (size_t)local_598;
        this->_numOfEdges = uVar13;
        this_00 = &this->_relations;
        std::vector<TDNode_*,_std::allocator<TDNode_*>_>::resize(this_00,(size_type)local_598);
        this_01 = &this->_attributes;
        std::vector<Attribute_*,_std::allocator<Attribute_*>_>::resize(this_01,uVar12);
        local_4c8 = this_01;
        if (uVar12 != 0) {
          local_4d0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&this->_attributeMap;
          uVar23 = 0;
LAB_0029e6a3:
          do {
            cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                    (char)(istream *)local_238);
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_5b8,cVar8);
            if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
              if ((*local_5b8 == '#') ||
                 (iVar9 = std::__cxx11::string::compare((char *)&local_5b8), iVar9 == 0))
              goto LAB_0029e6a3;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5b8,local_5b0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_4f0,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_590,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_420,' ');
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) +
                            (int)(istream *)local_3c0);
            pcVar7 = local_4f0;
            iVar9 = *piVar11;
            *piVar11 = 0;
            uVar14 = strtoul(local_4f0,(char **)&local_550,10);
            if (local_550._M_dataplus._M_p == pcVar7) {
              std::__throw_invalid_argument("stoul");
              goto LAB_0029f27a;
            }
            if (*piVar11 == 0) {
              *piVar11 = iVar9;
            }
            else if (*piVar11 == 0x22) goto LAB_0029f2a1;
            if (uVar23 != uVar14) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Inconsistent index specified in your DTree config file.\n",0x38);
            }
            iVar9 = std::__cxx11::string::compare((char *)&local_420);
            TVar26 = (Type)(iVar9 == 0);
            iVar9 = std::__cxx11::string::compare((char *)&local_420);
            if (iVar9 == 0) {
              TVar26 = Short;
            }
            iVar9 = std::__cxx11::string::compare((char *)&local_420);
            if (iVar9 == 0) {
              TVar26 = U_Integer;
            }
            pAVar15 = (Attribute *)operator_new(0x40);
            local_510 = local_500;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_510,local_590._M_dataplus._M_p,
                       local_590._M_dataplus._M_p + local_590._M_string_length);
            pAVar15->_id = (int)uVar23;
            (pAVar15->_name)._M_dataplus._M_p = (pointer)&(pAVar15->_name).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pAVar15->_name,local_510,local_510 + local_508);
            pAVar15->_type = TVar26;
            (pAVar15->_constant).first = false;
            (pAVar15->_constant).second = 0.0;
            (local_4c8->super__Vector_base<Attribute_*,_std::allocator<Attribute_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar23] = pAVar15;
            if (local_510 != local_500) {
              operator_delete(local_510);
            }
            pmVar16 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_4d0,&local_590);
            *pmVar16 = uVar23;
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar12);
        }
        if (local_598 !=
            (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)0x0) {
          ID = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)0x0;
LAB_0029e913:
          do {
            cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                    (char)(istream *)local_238);
            piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_238,(string *)&local_5b8,cVar8);
            if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
              if ((*local_5b8 == '#') ||
                 (iVar9 = std::__cxx11::string::compare((char *)&local_5b8), iVar9 == 0))
              goto LAB_0029e913;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5b8,local_5b0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_4f0,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_590,':');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_530,' ');
            pcVar7 = local_4f0;
            iVar9 = *piVar11;
            *piVar11 = 0;
            p_Var17 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)strtoul(local_4f0,(char **)&local_550,10);
            if (local_550._M_dataplus._M_p == pcVar7) goto LAB_0029f27a;
            if (*piVar11 == 0) {
              *piVar11 = iVar9;
            }
            else if (*piVar11 == 0x22) goto LAB_0029f2ad;
            if (ID != p_Var17) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Inconsistent index specified in your DTree config file.\n",0x38);
            }
            pTVar18 = (TDNode *)operator_new(0x70);
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4a0,local_590._M_dataplus._M_p,
                       local_590._M_dataplus._M_p + local_590._M_string_length);
            TDNode::TDNode(pTVar18,&local_4a0,(size_t)ID);
            (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
            super__Vector_impl_data._M_start[(long)ID] = pTVar18;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p);
            }
            pmVar16 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->_relationsMap,&local_590);
            *pmVar16 = (mapped_type)ID;
            iVar9 = (int)(istream *)local_3c0;
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + iVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),(char *)local_530,local_528);
            while (piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                       ((istream *)local_3c0,(string *)&local_400,','),
                  ((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) == 0) {
              pTVar18 = (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[(long)ID];
              pmVar16 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this->_attributeMap,&local_400);
              uVar12 = *pmVar16;
              if (99 < uVar12) {
                std::__throw_out_of_range_fmt
                          ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                           uVar12,100);
              }
              puVar1 = (ulong *)((long)(pTVar18->_bag).super__Base_bitset<2UL>._M_w +
                                (uVar12 >> 6) * 8);
              *puVar1 = *puVar1 | 1L << ((byte)uVar12 & 0x3f);
            }
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + iVar9);
            ID = ID + 1;
          } while (ID != local_598);
        }
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        local_550._M_string_length = 0;
        local_550.field_2._M_local_buf[0] = '\0';
        local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
        local_4c0._M_string_length = 0;
        local_4c0.field_2._M_local_buf[0] = '\0';
        if (uVar13 != 0) {
          uVar12 = 0;
          do {
            do {
              cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                      (char)(istream *)local_238);
              piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_238,(string *)&local_5b8,cVar8);
              if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
            } while ((*local_5b8 == '#') ||
                    (iVar9 = std::__cxx11::string::compare((char *)&local_5b8), iVar9 == 0));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5b8,local_5b0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_550,'-');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_4c0,' ');
            pmVar16 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->_relationsMap,&local_550);
            mVar3 = *pmVar16;
            pmVar16 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->_relationsMap,&local_4c0);
            plVar22 = (long *)(long)(int)*pmVar16;
            plVar24 = (long *)(long)(int)mVar3;
            ppTVar19 = (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            pTVar18 = ppTVar19[(long)plVar24];
            iVar4._M_current =
                 *(pointer *)
                  ((long)&(pTVar18->_neighbors).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8);
            if (iVar4._M_current ==
                *(pointer *)
                 ((long)&(pTVar18->_neighbors).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                 0x10)) {
              local_570 = plVar22;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&pTVar18->_neighbors,iVar4,(unsigned_long *)&local_570);
              ppTVar19 = (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                         super__Vector_impl_data._M_start;
            }
            else {
              *iVar4._M_current = (unsigned_long)plVar22;
              *(unsigned_long **)
               ((long)&(pTVar18->_neighbors).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               ) = iVar4._M_current + 1;
            }
            pTVar18 = ppTVar19[(long)plVar22];
            iVar4._M_current =
                 *(pointer *)
                  ((long)&(pTVar18->_neighbors).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8);
            local_570 = plVar24;
            if (iVar4._M_current ==
                *(pointer *)
                 ((long)&(pTVar18->_neighbors).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                 0x10)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&pTVar18->_neighbors,iVar4,(unsigned_long *)&local_570);
            }
            else {
              *iVar4._M_current = (unsigned_long)plVar24;
              *(unsigned_long **)
               ((long)&(pTVar18->_neighbors).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               ) = iVar4._M_current + 1;
            }
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0);
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar13);
        }
        if (this->_numOfRelations != 0) {
          local_598 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&this->_relationsMap;
          uVar12 = 0;
          do {
            ppTVar19 = (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            pTVar18 = ppTVar19[uVar12];
            puVar5 = (pTVar18->_neighbors).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar6 = *(pointer *)
                      ((long)&(pTVar18->_neighbors).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + 8);
            lVar27 = (long)puVar6 - (long)puVar5;
            uVar23 = lVar27 >> 3;
            pTVar18->_numOfNeighbors = uVar23;
            uVar13 = lVar27 * 2;
            pbVar20 = (bitset<100UL> *)operator_new__(-(ulong)(uVar23 >> 0x3c != 0) | uVar13);
            if (puVar6 != puVar5) {
              memset(pbVar20,0,uVar13 & 0xfffffffffffffff0);
            }
            ppTVar19[uVar12]->_neighborSchema = pbVar20;
            if ((ppTVar19[uVar12]->_numOfNeighbors == 1) || (this->_numOfRelations == 1)) {
              __args = &ppTVar19[uVar12]->_id;
              iVar4._M_current =
                   (this->_leafNodes).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->_leafNodes).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_leafNodes,
                           iVar4,__args);
              }
              else {
                *iVar4._M_current = *__args;
                (this->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
            }
            do {
              cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                      (char)(istream *)local_238);
              piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_238,(string *)&local_5b8,cVar8);
              if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
            } while ((*local_5b8 == '#') ||
                    (iVar9 = std::__cxx11::string::compare((char *)&local_5b8), iVar9 == 0));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_3c0 + 0x10),local_5b8,local_5b0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_590,' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_3c0,(string *)&local_530,' ');
            pmVar16 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_598,&local_590);
            plVar22 = local_530;
            mVar3 = *pmVar16;
            iVar9 = *piVar11;
            *piVar11 = 0;
            uVar13 = strtol((char *)local_530,(char **)&local_570,10);
            if (local_570 == plVar22) goto LAB_0029f289;
            if (((long)(int)uVar13 != uVar13) || (*piVar11 == 0x22)) goto LAB_0029f295;
            if (*piVar11 == 0) {
              *piVar11 = iVar9;
            }
            if ((int)mVar3 == -1) {
              std::operator+(&local_3e0,"The relation ",&local_590);
              plVar22 = (long *)std::__cxx11::string::append((char *)&local_3e0);
              plVar24 = plVar22 + 2;
              if ((long *)*plVar22 == plVar24) {
                local_560 = *plVar24;
                lStack_558 = plVar22[3];
                local_570 = &local_560;
              }
              else {
                local_560 = *plVar24;
                local_570 = (long *)*plVar22;
              }
              local_568 = plVar22[1];
              *plVar22 = (long)plVar24;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_570,local_568);
              if (local_570 != &local_560) {
                operator_delete(local_570);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                operator_delete(local_3e0._M_dataplus._M_p);
              }
            }
            if ((uVar13 & 0xfffffffe) != 0) {
              (this_00->super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>)._M_impl.
              super__Vector_impl_data._M_start[(int)mVar3]->_threads = uVar13;
            }
            std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0);
            uVar12 = uVar12 + 1;
          } while (uVar12 < this->_numOfRelations);
        }
        pTVar18 = *(this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        this->_root = pTVar18;
        if (pTVar18->_numOfNeighbors != 0) {
          uVar12 = (pTVar18->_bag).super__Base_bitset<2UL>._M_w[0];
          _Var25 = (pTVar18->_bag).super__Base_bitset<2UL>._M_w[1];
          pbVar20 = pTVar18->_neighborSchema;
          lVar27 = 0;
          uVar13 = 0;
          do {
            neighborSchema(this,(this->_relations).
                                super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [(pTVar18->_neighbors).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar13]],pTVar18->_id,
                           (var_bitset *)((long)(pbVar20->super__Base_bitset<2UL>)._M_w + lVar27));
            pTVar18 = this->_root;
            pbVar20 = pTVar18->_neighborSchema;
            uVar12 = uVar12 | *(ulong *)((long)(pbVar20->super__Base_bitset<2UL>)._M_w + lVar27);
            _Var25 = _Var25 | *(ulong *)((long)(pbVar20->super__Base_bitset<2UL>)._M_w + lVar27 + 8)
            ;
            uVar13 = uVar13 + 1;
            lVar27 = lVar27 + 0x10;
          } while (uVar13 < pTVar18->_numOfNeighbors);
          if (pTVar18->_numOfNeighbors != 0) {
            lVar27 = 8;
            uVar13 = 0;
            do {
              schema.super__Base_bitset<2UL>._M_w[0] =
                   ~*(ulong *)((long)(pTVar18->_neighborSchema->super__Base_bitset<2UL>)._M_w +
                              lVar27 + -8) & uVar12 |
                   (pTVar18->_bag).super__Base_bitset<2UL>._M_w[0];
              schema.super__Base_bitset<2UL>._M_w[1] =
                   ~*(ulong *)((long)(pTVar18->_neighborSchema->super__Base_bitset<2UL>)._M_w +
                              lVar27) & _Var25 & 0xfffffffff |
                   (pTVar18->_bag).super__Base_bitset<2UL>._M_w[1];
              parentNeighborSchema
                        (this,(this->_relations).
                              super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(pTVar18->_neighbors).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar13]],pTVar18->_id,schema
                        );
              uVar13 = uVar13 + 1;
              pTVar18 = this->_root;
              lVar27 = lVar27 + 0x10;
            } while (uVar13 < pTVar18->_numOfNeighbors);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p);
        }
        if (local_480 != local_470) {
          operator_delete(local_480);
        }
        if (local_460 != local_450) {
          operator_delete(local_460);
        }
        if (local_440 != local_430) {
          operator_delete(local_440);
        }
        if (local_4f0 != local_4e0) {
          operator_delete(local_4f0);
        }
        if (local_530 != (long *)local_520) {
          operator_delete(local_530);
        }
        if (local_420 != local_410) {
          operator_delete(local_420);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
        if (local_5b8 != local_5a8) {
          operator_delete(local_5b8);
        }
        std::ifstream::~ifstream(local_238);
        return;
      }
      goto LAB_0029f31a;
    }
  }
  std::__throw_invalid_argument("stoul");
LAB_0029f31a:
  uVar21 = std::__throw_invalid_argument("stoul");
  if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
    operator_delete((void *)local_3c0._0_8_);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar21);
LAB_0029f27a:
  std::__throw_invalid_argument("stoul");
LAB_0029f289:
  std::__throw_invalid_argument("stoi");
LAB_0029f295:
  std::__throw_out_of_range("stoi");
LAB_0029f2a1:
  std::__throw_out_of_range("stoul");
LAB_0029f2ad:
  std::__throw_out_of_range("stoul");
LAB_0029f2bc:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::config::TREEDECOMP_CONF_abi_cxx11_," does not exist. \n");
  std::operator<<((ostream *)&std::cerr,(string *)local_3c0);
  std::__cxx11::string::~string((string *)local_3c0);
  exit(1);
}

Assistant:

void TreeDecomposition::buildFromFile()
{
    /* Load the TreeDecomposition config file into an input stream. */
    std::ifstream input(multifaq::config::TREEDECOMP_CONF);

    if (!input)
    {
        ERROR(multifaq::config::TREEDECOMP_CONF+" does not exist. \n");
        exit(1);
    }

    DINFO("Building the TD from file: " << multifaq::config::TREEDECOMP_CONF << " ... ");
   
    /* Number of attributes and tables. */
    size_t n, m, e;

    /* String and associated stream to receive lines from the file. */
    std::string line;
    std::stringstream ssLine;

    /* String to receive the attributes from the relation. */
    std::string attribute;

    /* Read all the attributes - name and value - and parent and key. */
    std::string name;
    std::string type;
    std::string attrs;
    std::string index;
    
    /* Skmaip any comments at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;
    
        break;
    }

    /* Extract number of attributes and tables. */
    ssLine << line;

    std::string nString, mString, eString;
    getline(ssLine, nString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, mString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, eString, PARAMETER_SEPARATOR_CHAR);
   
    ssLine.clear();

    /* Convert the strings to integers. */
    n = stoul(nString);
    m = stoul(mString);
    e = stoul(eString);

    /* Set numOfAttributes and _numOfRelations. */
    this->_numOfAttributes = n;
    this->_numOfRelations = m;
    this->_numOfEdges = e;

    this->_relations.resize(m);
    // this->_attributesInRelation.resize(m);
    this->_attributes.resize(n);
   
    for (size_t i = 0; i < n; ++i)
    {
        /* Extract node information for each attribute. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        /* Get the six parameters specified for each attribute. */
        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, type, PARAMETER_SEPARATOR_CHAR);

        /* Clear string stream. */
        ssLine.clear();

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

        Type t = Type::Integer;        
        if (type.compare("double")==0) t = Type::Double;
        if (type.compare("short")==0) t = Type::Short;
        if (type.compare("uint")==0) t = Type::U_Integer;
        
        this->_attributes[i] = new Attribute(name, i, t);
        this->_attributeMap[name] = i;
    }
  
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < m; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        /* Get the three parameters specified for each relation. */
        // getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        // getline(ssLine, parent, PARAMETER_SEPARATOR_CHAR);

        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, NAME_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

#ifdef PRINT_TD
        DINFO( index << " " << name << " " << attrs << "\n");
#endif
        this->_relations[i] = new TDNode(name, i);
        this->_relationsMap[name] = i;

        /* Clear string stream. */
        ssLine.clear();

        ssLine << attrs;

        while (getline(ssLine, attribute, ATTRIBUTE_SEPARATOR_CHAR))
            this->_relations[i]->_bag.set(_attributeMap[attribute]);
        
        /* Clear string stream. */
        ssLine.clear();
    }

    std::string node1, node2;
    
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < e; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        getline(ssLine, node1, EDGE_SEPARATOR_CHAR);
        getline(ssLine, node2, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD
        DINFO( node1 << " - " << node2 << "\n");
#endif

        int n1 = _relationsMap[node1];
        int n2 = _relationsMap[node2];

        _relations[n1]->_neighbors.push_back(n2);
        _relations[n2]->_neighbors.push_back(n1);

        ssLine.clear();
    }
    
    for (size_t i = 0; i < _numOfRelations; i++)
    {
        _relations[i]->_numOfNeighbors = _relations[i]->_neighbors.size();
        _relations[i]->_neighborSchema = new var_bitset[_relations[i]->_numOfNeighbors];
        
        if (_relations[i]->_numOfNeighbors == 1 || _numOfRelations == 1)
            _leafNodes.push_back(_relations[i]->_id);


        /* Extract node information for each relation. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD        
        DINFO( name << " - " << attrs << "\n");
#endif
        int relID = _relationsMap[name];
        size_t threads = std::stoi(attrs);

        if (relID == -1)
            ERROR("The relation "+name+" was not found\n");
        
        if (threads > 1)
        {
            this->_relations[relID]->_threads = threads;
        }
        
        ssLine.clear();
    }
    
    // We are computing the schema!    
    this->_root = _relations[0];
    var_bitset rootSchemaBitset = _root->_bag;
    
    /* Setting neighborSchema for root node! */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        neighborSchema(getRelation(_root->_neighbors[n]), _root->_id,
                       _root->_neighborSchema[n]);

        rootSchemaBitset |= _root->_neighborSchema[n];
    }

    /* Propagating schema down */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        parentNeighborSchema(
            getRelation(_root->_neighbors[n]), _root->_id,
            (rootSchemaBitset & ~_root->_neighborSchema[n]) | _root->_bag);
    }
 
    // for (size_t i = 0; i < _numOfRelations; i++)
    // {
    //     printf("node: %s : ", getRelation(i)->_name.c_str());
    //     std::cout << getRelation(i)->_bag << "\n";
    //     for (size_t c = 0; c < getRelation(i)->_numOfNeighbors; c++)
    //         std::cout <<getRelation(i)->_neighborSchema[c] << " | ";
    //     std::cout << "\n";
    // }
}